

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O3

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  
  if (nread < 1) {
    sv_recv_cb_cold_1();
LAB_001894e8:
    sv_recv_cb_cold_2();
  }
  else {
    if (nread != 4) goto LAB_001894e8;
    if (addr != (sockaddr *)0x0) {
      if (*(int *)rcvbuf->base == 0x54495845) {
        uv_close((uv_handle_t *)handle,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return;
      }
      goto LAB_001894f2;
    }
  }
  sv_recv_cb_cold_4();
LAB_001894f2:
  sv_recv_cb_cold_3();
  if (handle == &client || handle == &server) {
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  uv_udp_send_t* req;
  uv_buf_t sndbuf;
  int r;

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  CHECK_HANDLE(handle);
  ASSERT(flags == 0);

  ASSERT_NOT_NULL(addr);
  ASSERT(nread == 4);
  ASSERT(!memcmp("PING", rcvbuf->base, nread));

  /* FIXME? `uv_udp_recv_stop` does what it says: recv_cb is not called
    * anymore. That's problematic because the read buffer won't be returned
    * either... Not sure I like that but it's consistent with `uv_read_stop`.
    */
  r = uv_udp_recv_stop(handle);
  ASSERT(r == 0);

  req = malloc(sizeof *req);
  ASSERT_NOT_NULL(req);

  sndbuf = uv_buf_init("PONG", 4);
  r = uv_udp_send(req, handle, &sndbuf, 1, addr, sv_send_cb);
  ASSERT(r == 0);

  sv_recv_cb_called++;
}